

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O3

void __thiscall
opengv::absolute_pose::modules::Epnp::estimate_R_and_t(Epnp *this,double (*R) [3],double *t)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  byte bVar11;
  bool bVar12;
  Index size;
  double *pdVar13;
  undefined8 unaff_RBP;
  double *pdVar14;
  long lVar15;
  double *pdVar16;
  ulong uVar17;
  Index index_1;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  double *pdVar21;
  int j;
  double *pdVar22;
  long lVar23;
  ulong uVar24;
  double dVar25;
  double dVar29;
  double dVar30;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  MatrixXd Abt_v;
  MatrixXd Abt;
  MatrixXd Abt_u;
  MatrixXd Abt_v_prime;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  double local_2f8;
  double dStack_2e8;
  double local_2d8 [3];
  DenseStorage<double,__1,__1,__1,_0> DStack_2c0;
  DenseStorage<double,__1,__1,__1,_0> local_2a8;
  DenseStorage<double,__1,__1,__1,_0> local_288;
  double *local_270;
  DenseStorage<double,__1,__1,__1,_0> local_268;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_250;
  
  local_2d8[2] = 0.0;
  dStack_2e8 = 0.0;
  local_2d8[0] = 0.0;
  local_2d8[1] = 0.0;
  local_2f8 = 0.0;
  iVar10 = this->number_of_correspondences;
  if (0 < (long)iVar10) {
    lVar15 = 0;
    do {
      pdVar21 = (double *)((long)this->pcs + lVar15);
      local_2d8[0] = *pdVar21 + local_2d8[0];
      local_2d8[1] = pdVar21[1] + local_2d8[1];
      local_2d8[2] = pdVar21[2] + local_2d8[2];
      pdVar21 = (double *)((long)this->pws + lVar15);
      lVar15 = lVar15 + 0x18;
      local_2f8 = *pdVar21 + local_2f8;
      dStack_2e8 = local_2f8;
    } while ((long)iVar10 * 0x18 != lVar15);
  }
  uVar17 = CONCAT71((int7)((ulong)unaff_RBP >> 8),7);
  auVar37._0_8_ = (double)iVar10;
  uVar24 = uVar17 & 0xffffffff;
  local_2a8.m_data = (double *)0x0;
  local_2a8.m_rows = 0;
  local_2a8.m_cols = 0;
  bVar11 = (byte)uVar24;
  auVar26._8_8_ = (ulong)((byte)(uVar24 >> 1) & 1) * (long)local_2d8[1];
  auVar26._0_8_ = (ulong)(bVar11 & 1) * (long)local_2d8[0];
  auVar26._16_8_ = (ulong)((byte)(uVar24 >> 2) & 1) * (long)local_2d8[2];
  auVar26._24_8_ = 0;
  auVar27._8_8_ = (ulong)((byte)(uVar24 >> 1) & 1) * (long)dStack_2e8;
  auVar27._0_8_ = (ulong)(bVar11 & 1) * (long)dStack_2e8;
  auVar27._16_8_ = (ulong)((byte)(uVar24 >> 2) & 1) * (long)dStack_2e8;
  auVar27._24_8_ = 0;
  auVar37._8_8_ = auVar37._0_8_;
  auVar37._16_8_ = auVar37._0_8_;
  auVar37._24_8_ = auVar37._0_8_;
  auVar26 = vdivpd_avx(auVar26,auVar37);
  auVar27 = vdivpd_avx(auVar27,auVar37);
  local_2d8[0] = (double)((ulong)(bVar11 & 1) * auVar26._0_8_ |
                         (ulong)!(bool)(bVar11 & 1) * (long)local_2d8[0]);
  bVar12 = (bool)((byte)(uVar24 >> 1) & 1);
  local_2d8[1] = (double)((ulong)bVar12 * auVar26._8_8_ | (ulong)!bVar12 * (long)local_2d8[1]);
  bVar12 = (bool)((byte)(uVar24 >> 2) & 1);
  local_2d8[2] = (double)((ulong)bVar12 * auVar26._16_8_ | (ulong)!bVar12 * (long)local_2d8[2]);
  dVar25 = (double)((ulong)(bVar11 & 1) * auVar27._0_8_ |
                   (ulong)!(bool)(bVar11 & 1) * (long)dStack_2e8);
  bVar12 = (bool)((byte)(uVar24 >> 1) & 1);
  dVar29 = (double)((ulong)bVar12 * auVar27._8_8_ | (ulong)!bVar12 * (long)dStack_2e8);
  bVar12 = (bool)((byte)(uVar24 >> 2) & 1);
  dVar30 = (double)((ulong)bVar12 * auVar27._16_8_ | (ulong)!bVar12 * (long)dStack_2e8);
  local_270 = t;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_2a8,9,3,3);
  lVar15 = 0;
  auVar26 = vpbroadcastq_avx512vl();
  auVar26 = vpmullq_avx512vl(auVar26,_DAT_001e3a20);
  auVar27 = vpbroadcastq_avx512vl();
  auVar26 = vpaddq_avx2(auVar27,auVar26);
  do {
    auVar27 = vpbroadcastq_avx512vl();
    lVar15 = lVar15 + 1;
    auVar27 = vpsllq_avx2(auVar27,3);
    auVar27 = vpaddq_avx2(auVar26,auVar27);
    vscatterqpd_avx512vl
              (ZEXT832(0) + auVar27,uVar17 & 0xffffffff,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  } while (lVar15 != 3);
  iVar10 = this->number_of_correspondences;
  if (0 < (long)iVar10) {
    pdVar21 = this->pws;
    pdVar16 = this->pcs;
    lVar15 = 0;
    do {
      lVar23 = 3;
      pdVar13 = local_2d8;
      pdVar14 = local_2a8.m_data;
      pdVar22 = pdVar16;
      do {
        dVar31 = *pdVar13;
        pdVar13 = pdVar13 + 1;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *pdVar14;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *pdVar22 - dVar31;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = pdVar21[lVar15 * 3] - dVar25;
        auVar3 = vfmadd213sd_fma(auVar42,auVar49,auVar3);
        *pdVar14 = auVar3._0_8_;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = pdVar14[local_2a8.m_rows];
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *pdVar22 - dVar31;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = pdVar21[lVar15 * 3 + 1] - dVar29;
        auVar3 = vfmadd213sd_fma(auVar43,auVar50,auVar4);
        pdVar14[local_2a8.m_rows] = auVar3._0_8_;
        dVar1 = *pdVar22;
        pdVar22 = pdVar22 + 1;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = pdVar14[local_2a8.m_rows * 2];
        auVar44._8_8_ = 0;
        auVar44._0_8_ = dVar1 - dVar31;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = pdVar21[lVar15 * 3 + 2] - dVar30;
        auVar3 = vfmadd213sd_fma(auVar44,auVar51,auVar5);
        pdVar14[local_2a8.m_rows * 2] = auVar3._0_8_;
        pdVar14 = pdVar14 + 1;
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
      lVar15 = lVar15 + 1;
      pdVar16 = pdVar16 + 3;
    } while (lVar15 != iVar10);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_250,(MatrixType *)&local_2a8,0x14);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_288,(DenseStorage<double,__1,__1,__1,_0> *)&local_250);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&DStack_2c0,
             (DenseStorage<double,__1,__1,__1,_0> *)
             &local_250.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV);
  lVar15 = 0;
  pdVar21 = local_288.m_data + local_288.m_rows;
  do {
    lVar23 = 0;
    pdVar16 = DStack_2c0.m_data + DStack_2c0.m_rows;
    do {
      if (DStack_2c0.m_cols == 0) {
        dVar31 = 0.0;
      }
      else {
        dVar31 = local_288.m_data[lVar15] * DStack_2c0.m_data[lVar23];
        pdVar13 = pdVar21;
        lVar18 = DStack_2c0.m_cols + -1;
        pdVar14 = pdVar16;
        if (1 < DStack_2c0.m_cols) {
          do {
            lVar18 = lVar18 + -1;
            dVar31 = dVar31 + *pdVar13 * *pdVar14;
            pdVar13 = pdVar13 + local_288.m_rows;
            pdVar14 = pdVar14 + DStack_2c0.m_rows;
          } while (lVar18 != 0);
        }
      }
      R[lVar15][lVar23] = dVar31;
      lVar23 = lVar23 + 1;
      pdVar16 = pdVar16 + 1;
    } while (lVar23 != 3);
    lVar15 = lVar15 + 1;
    pdVar21 = pdVar21 + 1;
  } while (lVar15 != 3);
  dVar31 = (*R)[1];
  dVar2 = (*R)[0];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = R[2][0];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = R[2][2];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = R[2][1];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar2 * R[1][1];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar31 * R[1][2] * R[2][0];
  auVar3 = vfmadd231sd_fma(auVar52,auVar47,auVar38);
  dVar1 = (*R)[2];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = R[1][0] * dVar1;
  auVar3 = vfmadd213sd_fma(auVar55,auVar56,auVar3);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = R[1][1] * dVar1;
  auVar3 = vfnmadd213sd_fma(auVar45,auVar54,auVar3);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = R[1][0] * dVar31;
  auVar3 = vfnmadd213sd_fma(auVar53,auVar47,auVar3);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = R[1][2] * dVar2;
  auVar3 = vfnmadd213sd_fma(auVar46,auVar56,auVar3);
  if (auVar3._0_8_ < 0.0) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_268,&DStack_2c0);
    pdVar21 = local_268.m_data + local_268.m_rows * 2;
    uVar17 = local_268.m_rows;
    if ((((ulong)pdVar21 & 7) == 0) &&
       (uVar17 = (ulong)(-((uint)((ulong)pdVar21 >> 3) & 0x1fffffff) & 7),
       local_268.m_rows <= (long)uVar17)) {
      uVar17 = local_268.m_rows;
    }
    uVar19 = local_268.m_rows - uVar17;
    uVar24 = uVar19 + 7;
    if (-1 < (long)uVar19) {
      uVar24 = uVar19;
    }
    if (0 < (long)uVar17) {
      uVar20 = 0;
      do {
        auVar34._0_8_ = -DStack_2c0.m_data[DStack_2c0.m_rows * 2 + uVar20];
        auVar34._8_8_ = 0x8000000000000000;
        dVar31 = (double)vmovlpd_avx(auVar34);
        pdVar21[uVar20] = dVar31;
        uVar20 = uVar20 + 1;
      } while (uVar17 != uVar20);
    }
    uVar24 = (uVar24 & 0xfffffffffffffff8) + uVar17;
    if (7 < (long)uVar19) {
      do {
        auVar28 = vsubpd_avx512f(ZEXT864(0) << 0x40,
                                 *(undefined1 (*) [64])
                                  (DStack_2c0.m_data + DStack_2c0.m_rows * 2 + uVar17));
        *(undefined1 (*) [64])(pdVar21 + uVar17) = auVar28;
        uVar17 = uVar17 + 8;
      } while ((long)uVar17 < (long)uVar24);
    }
    if ((long)uVar24 < local_268.m_rows) {
      do {
        auVar35._0_8_ = -DStack_2c0.m_data[DStack_2c0.m_rows * 2 + uVar24];
        auVar35._8_8_ = 0x8000000000000000;
        dVar31 = (double)vmovlpd_avx(auVar35);
        pdVar21[uVar24] = dVar31;
        uVar24 = uVar24 + 1;
      } while (local_268.m_rows != uVar24);
    }
    lVar15 = 0;
    pdVar21 = local_288.m_data + local_288.m_rows;
    do {
      lVar23 = 0;
      pdVar16 = local_268.m_data + local_268.m_rows;
      do {
        if (local_268.m_cols == 0) {
          dVar31 = 0.0;
        }
        else {
          dVar31 = local_288.m_data[lVar15] * local_268.m_data[lVar23];
          pdVar13 = pdVar16;
          pdVar14 = pdVar21;
          lVar18 = local_268.m_cols + -1;
          if (1 < local_268.m_cols) {
            do {
              lVar18 = lVar18 + -1;
              dVar31 = dVar31 + *pdVar14 * *pdVar13;
              pdVar13 = pdVar13 + local_268.m_rows;
              pdVar14 = pdVar14 + local_288.m_rows;
            } while (lVar18 != 0);
          }
        }
        R[lVar15][lVar23] = dVar31;
        lVar23 = lVar23 + 1;
        pdVar16 = pdVar16 + 1;
      } while (lVar23 != 3);
      lVar15 = lVar15 + 1;
      pdVar21 = pdVar21 + 1;
    } while (lVar15 != 3);
    if (local_268.m_data != (double *)0x0) {
      free((void *)local_268.m_data[-1]);
    }
    dVar2 = (*R)[0];
    dVar31 = (*R)[1];
    dVar1 = (*R)[2];
  }
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar1;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar2;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar25;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar31 * dVar29;
  auVar3 = vfmadd231sd_fma(auVar36,auVar48,auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar30;
  auVar3 = vfmadd231sd_fma(auVar3,auVar33,auVar39);
  *local_270 = local_2d8[0] - auVar3._0_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = R[1][0];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar29 * R[1][1];
  auVar3 = vfmadd231sd_fma(auVar40,auVar48,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = R[1][2];
  auVar3 = vfmadd231sd_fma(auVar3,auVar33,auVar7);
  local_270[1] = local_2d8[1] - auVar3._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = R[2][0];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar29 * R[2][1];
  auVar3 = vfmadd231sd_fma(auVar41,auVar48,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = R[2][2];
  auVar3 = vfmadd231sd_fma(auVar3,auVar33,auVar9);
  local_270[2] = local_2d8[2] - auVar3._0_8_;
  if (DStack_2c0.m_data != (double *)0x0) {
    free((void *)DStack_2c0.m_data[-1]);
  }
  if (local_288.m_data != (double *)0x0) {
    free((void *)local_288.m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_250);
  if (local_2a8.m_data != (double *)0x0) {
    free((void *)local_2a8.m_data[-1]);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::estimate_R_and_t(
    double R[3][3],
    double t[3])
{
  double pc0[3], pw0[3];

  pc0[0] = pc0[1] = pc0[2] = 0.0;
  pw0[0] = pw0[1] = pw0[2] = 0.0;

  for(int i = 0; i < number_of_correspondences; i++)
  {
    const double * pc = pcs + 3 * i;
    const double * pw = pws + 3 * i;

    for(int j = 0; j < 3; j++)
    {
      pc0[j] += pc[j];
      pw0[j] += pw[j];
    }
  }
  for(int j = 0; j < 3; j++)
  {
    pc0[j] /= number_of_correspondences;
    pw0[j] /= number_of_correspondences;
  }

  Eigen::MatrixXd Abt(3,3);

  for(int i = 0; i < 3; i++)
  {
    for(int j = 0; j < 3; j++)
      Abt(i,j) = 0.0;
  }

  for(int i = 0; i < number_of_correspondences; i++)
  {
    double * pc = pcs + 3 * i;
    double * pw = pws + 3 * i;

    for(int j = 0; j < 3; j++)
    {
      Abt(j,0) += (pc[j] - pc0[j]) * (pw[0] - pw0[0]);
      Abt(j,1) += (pc[j] - pc0[j]) * (pw[1] - pw0[1]);
      Abt(j,2) += (pc[j] - pc0[j]) * (pw[2] - pw0[2]);
    }
  }

  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      Abt,
      Eigen::ComputeFullV | Eigen::ComputeFullU );
  Eigen::MatrixXd Abt_u = SVD.matrixU();
  Eigen::MatrixXd Abt_v = SVD.matrixV();

  for(int i = 0; i < 3; i++)
    for(int j = 0; j < 3; j++)
      R[i][j] = Abt_u.row(i) * Abt_v.row(j).transpose();

  const double det =
      R[0][0] * R[1][1] * R[2][2] +
      R[0][1] * R[1][2] * R[2][0] +
      R[0][2] * R[1][0] * R[2][1] -
      R[0][2] * R[1][1] * R[2][0] -
      R[0][1] * R[1][0] * R[2][2] -
      R[0][0] * R[1][2] * R[2][1];

  //change 1: negative determinant problem is solved by changing Abt_v, not R

  if (det < 0)
  {
    //R[2][0] = -R[2][0];
    //R[2][1] = -R[2][1];
    //R[2][2] = -R[2][2];
    Eigen::MatrixXd Abt_v_prime = Abt_v;
    Abt_v_prime.col(2) = -Abt_v.col(2);
    for(int i = 0; i < 3; i++)
      for(int j = 0; j < 3; j++)
        R[i][j] = Abt_u.row(i) * Abt_v_prime.row(j).transpose();
  }

  t[0] = pc0[0] - dot(R[0], pw0);
  t[1] = pc0[1] - dot(R[1], pw0);
  t[2] = pc0[2] - dot(R[2], pw0);
}